

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ParseHelper.cpp
# Opt level: O3

void __thiscall
glslang::TParseContext::checkIoArraysConsistency(TParseContext *this,TSourceLoc *loc,bool tailOnly)

{
  pointer feature;
  int iVar1;
  uint uVar2;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  undefined4 extraout_var_01;
  undefined7 in_register_00000011;
  ulong uVar3;
  bool bVar4;
  ulong uVar5;
  ulong uVar6;
  TString featureString;
  TString local_58;
  TType *type;
  
  local_58._M_dataplus.super_allocator_type.allocator = GetThreadPoolAllocator();
  uVar6 = 0;
  local_58._M_string_length = 0;
  local_58.field_2._M_local_buf[0] = '\0';
  uVar5 = (long)(this->ioArraySymbolResizeList).
                super_vector<glslang::TSymbol_*,_glslang::pool_allocator<glslang::TSymbol_*>_>.
                super__Vector_base<glslang::TSymbol_*,_glslang::pool_allocator<glslang::TSymbol_*>_>
                ._M_impl.super__Vector_impl_data._M_finish -
          (long)(this->ioArraySymbolResizeList).
                super_vector<glslang::TSymbol_*,_glslang::pool_allocator<glslang::TSymbol_*>_>.
                super__Vector_base<glslang::TSymbol_*,_glslang::pool_allocator<glslang::TSymbol_*>_>
                ._M_impl.super__Vector_impl_data._M_start >> 3;
  uVar3 = uVar5 - 1;
  if ((int)CONCAT71(in_register_00000011,tailOnly) == 0) {
    uVar3 = uVar6;
  }
  if (uVar3 < uVar5) {
    bVar4 = true;
    local_58._M_dataplus._M_p = (pointer)&local_58.field_2;
    do {
      iVar1 = (*(this->ioArraySymbolResizeList).
                super_vector<glslang::TSymbol_*,_glslang::pool_allocator<glslang::TSymbol_*>_>.
                super__Vector_base<glslang::TSymbol_*,_glslang::pool_allocator<glslang::TSymbol_*>_>
                ._M_impl.super__Vector_impl_data._M_start[uVar3]->_vptr_TSymbol[0xd])();
      type = (TType *)CONCAT44(extraout_var,iVar1);
      if ((bVar4) || ((this->super_TParseContextBase).super_TParseVersions.language == EShLangMesh))
      {
        iVar1 = (*type->_vptr_TType[10])(type);
        uVar2 = getIoArrayImplicitSize(this,(TQualifier *)CONCAT44(extraout_var_00,iVar1),&local_58)
        ;
        uVar6 = (ulong)uVar2;
        if (uVar2 == 0) {
          return;
        }
      }
      feature = local_58._M_dataplus._M_p;
      iVar1 = (*(this->ioArraySymbolResizeList).
                super_vector<glslang::TSymbol_*,_glslang::pool_allocator<glslang::TSymbol_*>_>.
                super__Vector_base<glslang::TSymbol_*,_glslang::pool_allocator<glslang::TSymbol_*>_>
                ._M_impl.super__Vector_impl_data._M_start[uVar3]->_vptr_TSymbol[3])();
      checkIoArrayConsistency
                (this,loc,(int)uVar6,feature,type,(TString *)CONCAT44(extraout_var_01,iVar1));
      uVar3 = uVar3 + 1;
      bVar4 = false;
    } while (uVar5 != uVar3);
  }
  return;
}

Assistant:

void TParseContext::checkIoArraysConsistency(const TSourceLoc &loc, bool tailOnly)
{
    int requiredSize = 0;
    TString featureString;
    size_t listSize = ioArraySymbolResizeList.size();
    size_t i = 0;

    // If tailOnly = true, only check the last array symbol in the list.
    if (tailOnly) {
        i = listSize - 1;
    }
    for (bool firstIteration = true; i < listSize; ++i) {
        TType &type = ioArraySymbolResizeList[i]->getWritableType();

        // As I/O array sizes don't change, fetch requiredSize only once,
        // except for mesh shaders which could have different I/O array sizes based on type qualifiers.
        if (firstIteration || (language == EShLangMesh)) {
            requiredSize = getIoArrayImplicitSize(type.getQualifier(), &featureString);
            if (requiredSize == 0)
                break;
            firstIteration = false;
        }

        checkIoArrayConsistency(loc, requiredSize, featureString.c_str(), type,
                                ioArraySymbolResizeList[i]->getName());
    }
}